

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

int psa_cmac_setup(psa_mac_operation_t *operation,size_t key_bits,psa_key_slot_t *slot,
                  mbedtls_cipher_info_t *cipher_info)

{
  int ret;
  mbedtls_cipher_info_t *cipher_info_local;
  psa_key_slot_t *slot_local;
  size_t key_bits_local;
  psa_mac_operation_t *operation_local;
  
  operation->mac_size = (uint8_t)cipher_info->block_size;
  operation_local._4_4_ = mbedtls_cipher_setup(&(operation->ctx).cmac,cipher_info);
  if (operation_local._4_4_ == 0) {
    operation_local._4_4_ =
         mbedtls_cipher_cmac_starts(&(operation->ctx).cmac,(slot->data).raw.data,key_bits);
  }
  return operation_local._4_4_;
}

Assistant:

static int psa_cmac_setup( psa_mac_operation_t *operation,
                           size_t key_bits,
                           psa_key_slot_t *slot,
                           const mbedtls_cipher_info_t *cipher_info )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    operation->mac_size = cipher_info->block_size;

    ret = mbedtls_cipher_setup( &operation->ctx.cmac, cipher_info );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_cipher_cmac_starts( &operation->ctx.cmac,
                                      slot->data.raw.data,
                                      key_bits );
    return( ret );
}